

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O2

void __thiscall ON_WindowsBitmap::Internal_Destroy(ON_WindowsBitmap *this)

{
  if (this->m_bmi != (ON_WindowsBITMAPINFO *)0x0) {
    if ((this->m_bFreeBMI | 2U) == 3) {
      onfree(this->m_bmi);
    }
    this->m_bmi = (ON_WindowsBITMAPINFO *)0x0;
  }
  if (this->m_bits != (uchar *)0x0) {
    if ((this->m_bFreeBMI & 0xfffffffeU) == 2) {
      onfree(this->m_bits);
    }
    this->m_bits = (uchar *)0x0;
  }
  this->m_bFreeBMI = 0;
  return;
}

Assistant:

void ON_WindowsBitmap::Internal_Destroy()
{
  if (nullptr != m_bmi) 
  {
    if ( 1 == m_bFreeBMI || 3 == m_bFreeBMI )
      onfree(m_bmi);
    m_bmi = nullptr;
  }

  if ( nullptr != m_bits )
  {
    if ( 2 == m_bFreeBMI || 3 == m_bFreeBMI )
      onfree(m_bits);
    m_bits = nullptr;
  }

  m_bFreeBMI = 0;
}